

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_scaling_list(bs_t *b,int *scalingList,int sizeOfScalingList,
                       int *useDefaultScalingMatrixFlag)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)sizeOfScalingList;
  if (sizeOfScalingList < 1) {
    uVar4 = uVar3;
  }
  iVar2 = 8;
  iVar1 = 8;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      if (*useDefaultScalingMatrixFlag == 0) {
        iVar2 = scalingList[uVar3];
      }
      bs_write_se(b,(iVar2 - iVar1) % 0x100);
    }
    iVar1 = scalingList[uVar3];
  }
  return;
}

Assistant:

void write_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 1 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            bs_write_se(b, delta_scale);

            if( 0 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 0 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}